

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

uint8 * rw::xbox::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  long lVar1;
  long *plVar2;
  RasterLevels *levels;
  XboxRaster *natras;
  int32 lockMode_local;
  int32 level_local;
  Raster *raster_local;
  
  plVar2 = (long *)((long)&raster->platform + (long)nativeRasterOffset);
  if ((raster->privateFlags & 6U) == 0) {
    lVar1 = *plVar2;
    raster->pixels = *(uint8 **)(lVar1 + (long)level * 0x18 + 0x18);
    raster->width = *(int32 *)(lVar1 + 8 + (long)level * 0x18);
    raster->height = *(int32 *)(lVar1 + (long)level * 0x18 + 0xc);
    raster->stride = raster->width * *(int *)((long)plVar2 + 0x14);
    if ((lockMode & 2U) != 0) {
      raster->privateFlags = raster->privateFlags | 2;
    }
    if ((lockMode & 1U) != 0) {
      raster->privateFlags = raster->privateFlags | 4;
    }
    raster_local = (Raster *)raster->pixels;
  }
  else {
    raster_local = (Raster *)0x0;
  }
  return (uint8 *)raster_local;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	XboxRaster *natras = GETXBOXRASTEREXT(raster);

	// check if already locked
	if(raster->privateFlags & (Raster::PRIVATELOCK_READ|Raster::PRIVATELOCK_WRITE))
		return nil;

	RasterLevels *levels = (RasterLevels*)natras->texture;
	raster->pixels = levels->levels[level].data;
	raster->width = levels->levels[level].width;
	raster->height = levels->levels[level].height;
	raster->stride = raster->width*natras->bpp;

	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;

	return raster->pixels;
}